

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O0

void __thiscall deci::parser_t::yy_stack_print_(parser_t *this)

{
  bool bVar1;
  ostream *this_00;
  pointer psVar2;
  __normal_iterator<const_deci::parser_t::stack_symbol_type_*,_std::vector<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>_>
  local_20;
  const_iterator i_end;
  const_iterator i;
  parser_t *this_local;
  
  std::operator<<(this->yycdebug_,"Stack now");
  i_end = stack<deci::parser_t::stack_symbol_type,_std::vector<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>_>
          ::begin(&this->yystack_);
  local_20._M_current =
       (stack_symbol_type *)
       stack<deci::parser_t::stack_symbol_type,_std::vector<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>_>
       ::end(&this->yystack_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&i_end,&local_20);
    if (!bVar1) break;
    this_00 = std::operator<<(this->yycdebug_,' ');
    psVar2 = __gnu_cxx::
             __normal_iterator<const_deci::parser_t::stack_symbol_type_*,_std::vector<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>_>
             ::operator->(&i_end);
    std::ostream::operator<<
              (this_00,(int)(psVar2->super_basic_symbol<deci::parser_t::by_state>).super_by_state.
                            state);
    __gnu_cxx::
    __normal_iterator<const_deci::parser_t::stack_symbol_type_*,_std::vector<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>_>
    ::operator++(&i_end);
  }
  std::operator<<(this->yycdebug_,'\n');
  return;
}

Assistant:

void
   parser_t ::yy_stack_print_ () const
  {
    *yycdebug_ << "Stack now";
    for (stack_type::const_iterator
           i = yystack_.begin (),
           i_end = yystack_.end ();
         i != i_end; ++i)
      *yycdebug_ << ' ' << int (i->state);
    *yycdebug_ << '\n';
  }